

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  char closeSegment;
  undefined8 in_RAX;
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  undefined4 uStack_38;
  int index;
  
  _uStack_38 = in_RAX;
  uVar1 = std::__cxx11::string::rfind((string *)ustring,(ulong)keyword);
  uVar3 = uVar1;
  if (keyword->_M_string_length + uVar1 + 1 < ustring->_M_string_length) {
    pbVar2 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + uVar1);
    while ((((uVar3 = uVar1, *pbVar2 - 0x2a < 0x35 &&
             ((0x10000000000021U >> ((ulong)(*pbVar2 - 0x2a) & 0x3f) & 1) != 0)) &&
            (uVar3 = 0xffffffffffffffff, uVar1 != 0)) &&
           (uVar1 = std::__cxx11::string::rfind((string *)ustring,(ulong)keyword),
           uVar1 != 0xffffffffffffffff))) {
      pbVar2 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + uVar1);
    }
  }
  while( true ) {
    if (uVar3 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    uVar1 = std::__cxx11::string::find_last_of((char *)ustring,0x13dff5);
    if (uVar1 == 0xffffffffffffffff) {
      return uVar3;
    }
    if (uVar1 < uVar3) {
      return uVar3;
    }
    closeSegment = getMatchCharacter((ustring->_M_dataplus)._M_p[uVar1]);
    _uStack_38 = CONCAT44((int)uVar1 + -2,uStack_38);
    segmentcheckReverse(ustring,closeSegment,&index);
    if ((long)index < 0) break;
    if ((ulong)(long)index < uVar3) {
      uVar3 = std::__cxx11::string::rfind((string *)ustring,(ulong)keyword);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}